

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::setsubstr(CBString *this,int pos,char *s,uchar cfill)

{
  int iVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  allocator local_99;
  CBStringException bstr__cppwrapper_exception;
  string local_70;
  string local_50;
  tagbstring t;
  
  if (s == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"CBString::setsubstr NULL.",&local_99);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  t.data = (uchar *)s;
  sVar2 = strlen(s);
  t.slen = (int)sVar2;
  t.mlen = -1;
  iVar1 = bsetstr(&this->super_tagbstring,pos,&t,cfill);
  if (iVar1 != -1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_70,"CBString::Failure in setsubstr",&local_99);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::setsubstr (int pos, const char * s, unsigned char cfill) {
struct tagbstring t;
	if (NULL == s) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("setsubstr NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, s);
	if (BSTR_ERR == bsetstr (this, pos, &t, cfill)) {
		bstringThrow ("Failure in setsubstr");
	}
}